

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

TRef lj_opt_fwd_xload(jit_State *J)

{
  IRIns *xb;
  ushort uVar1;
  ushort uVar2;
  AliasRet AVar3;
  TRef TVar4;
  ushort local_40;
  IRType st;
  IRType dt;
  IRIns *store;
  IRRef ref;
  IRRef lim;
  IRIns *xr;
  IRRef xref;
  jit_State *J_local;
  
  store._4_4_ = (uint)(J->fold).ins.field_0.op1;
  _ref = (J->cur).ir + store._4_4_;
  xr._4_4_ = store._4_4_;
  if (((J->fold).ins.field_0.op2 & 1) != 0) goto LAB_00142151;
  if (((J->fold).ins.field_0.op2 & 2) != 0) {
LAB_0014225c:
    TVar4 = lj_ir_emit(J);
    return TVar4;
  }
  store._0_4_ = (uint)J->chain[0x4e];
  do {
    store._4_4_ = xr._4_4_;
    if (xr._4_4_ < J->chain[99]) {
      store._4_4_ = (uint)J->chain[99];
    }
    if (store._4_4_ < J->chain[0x5a]) {
      store._4_4_ = (uint)J->chain[0x5a];
    }
    while (store._4_4_ < (uint)store) {
      xb = (J->cur).ir + (uint)store;
      AVar3 = aa_xref(J,_ref,&(J->fold).ins,xb);
      if (AVar3 != ALIAS_NO) {
        if (AVar3 == ALIAS_MAY) {
          store._4_4_ = (uint)store;
          break;
        }
        if (AVar3 == ALIAS_MUST) {
          if ((((J->fold).ins.field_1.t.irt ^
               *(byte *)((long)(J->cur).ir + (ulong)(xb->field_0).op2 * 8 + 4)) & 0x1f) != 0) {
            uVar2 = (J->fold).ins.field_1.t.irt & 0x1f;
            if ((uVar2 == 0xf) || (uVar2 == 0x11)) {
              local_40 = uVar2 | 0x800;
              uVar1 = 0x13;
            }
            else if ((uVar2 == 0x10) ||
                    (local_40 = *(byte *)((long)(J->cur).ir + (ulong)(xb->field_0).op2 * 8 + 4) &
                                0x1f, uVar1 = uVar2, uVar2 == 0x12)) {
              uVar1 = 0x13;
              local_40 = uVar2;
            }
            (J->fold).ins.field_0.ot = uVar1 | 0x5b00;
            (J->fold).ins.field_0.op1 = (xb->field_0).op2;
            (J->fold).ins.field_0.op2 = uVar1 << 5 | local_40;
            return 1;
          }
          return (uint)(xb->field_0).op2;
        }
      }
      store._0_4_ = (uint)(xb->field_0).prev;
    }
LAB_00142151:
    uVar2 = J->chain[0x46];
    while (store._0_4_ = (uint)uVar2, store._4_4_ < (uint)store) {
      if (((J->cur).ir[(uint)store].field_0.op1 == xr._4_4_) &&
         (((*(byte *)((long)(J->cur).ir + (ulong)(uint)store * 8 + 4) ^ (J->fold).ins.field_1.t.irt)
          & 0x1f) == 0)) {
        return (uint)store;
      }
      uVar2 = *(ushort *)((long)(J->cur).ir + (ulong)(uint)store * 8 + 6);
    }
    if ((((((J->fold).ins.field_0.op2 & 1) != 0) || (J->chain[0x11] == 0)) ||
        (xr._4_4_ != (J->fold).ins.field_0.op1)) || (xr._4_4_ = reassoc_xref(J,_ref), xr._4_4_ == 0)
       ) goto LAB_0014225c;
    uVar2 = J->chain[0x4e];
    while (store._0_4_ = (uint)uVar2, store._4_4_ < (uint)store) {
      uVar2 = *(ushort *)((long)(J->cur).ir + (ulong)(uint)store * 8 + 6);
    }
    _ref = (J->cur).ir + xr._4_4_;
  } while( true );
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_xload(jit_State *J)
{
  IRRef xref = fins->op1;
  IRIns *xr = IR(xref);
  IRRef lim = xref;  /* Search limit. */
  IRRef ref;

  if ((fins->op2 & IRXLOAD_READONLY))
    goto cselim;
  if ((fins->op2 & IRXLOAD_VOLATILE))
    goto doemit;

  /* Search for conflicting stores. */
  ref = J->chain[IR_XSTORE];
retry:
  if (J->chain[IR_CALLXS] > lim) lim = J->chain[IR_CALLXS];
  if (J->chain[IR_XBAR] > lim) lim = J->chain[IR_XBAR];
  while (ref > lim) {
    IRIns *store = IR(ref);
    switch (aa_xref(J, xr, fins, store)) {
    case ALIAS_NO:   break;  /* Continue searching. */
    case ALIAS_MAY:  lim = ref; goto cselim;  /* Limit search for load. */
    case ALIAS_MUST:
      /* Emit conversion if the loaded type doesn't match the forwarded type. */
      if (!irt_sametype(fins->t, IR(store->op2)->t)) {
	IRType dt = irt_type(fins->t), st = irt_type(IR(store->op2)->t);
	if (dt == IRT_I8 || dt == IRT_I16) {  /* Trunc + sign-extend. */
	  st = dt | IRCONV_SEXT;
	  dt = IRT_INT;
	} else if (dt == IRT_U8 || dt == IRT_U16) {  /* Trunc + zero-extend. */
	  st = dt;
	  dt = IRT_INT;
	}
	fins->ot = IRT(IR_CONV, dt);
	fins->op1 = store->op2;
	fins->op2 = (dt<<5)|st;
	return RETRYFOLD;
      }
      return store->op2;  /* Store forwarding. */
    }
    ref = store->prev;
  }

cselim:
  /* Try to find a matching load. Below the conflicting store, if any. */
  ref = J->chain[IR_XLOAD];
  while (ref > lim) {
    /* CSE for XLOAD depends on the type, but not on the IRXLOAD_* flags. */
    if (IR(ref)->op1 == xref && irt_sametype(IR(ref)->t, fins->t))
      return ref;
    ref = IR(ref)->prev;
  }

  /* Reassociate XLOAD across PHIs to handle a[i-1] forwarding case. */
  if (!(fins->op2 & IRXLOAD_READONLY) && J->chain[IR_LOOP] &&
      xref == fins->op1 && (xref = reassoc_xref(J, xr)) != 0) {
    ref = J->chain[IR_XSTORE];
    while (ref > lim)  /* Skip stores that have already been checked. */
      ref = IR(ref)->prev;
    lim = xref;
    xr = IR(xref);
    goto retry;  /* Retry with the reassociated reference. */
  }
doemit:
  return EMITFOLD;
}